

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

void pageant_conn_got_response(PageantClient *pc,PageantClientRequestId *reqid,ptrlen response)

{
  PageantClientInfo *ptr;
  PageantClient *pPVar1;
  strbuf *psVar2;
  
  psVar2 = strbuf_new_nm();
  *(strbuf **)(reqid + -2) = psVar2;
  BinarySink_put_stringpl(psVar2->binarysink_,response);
  while ((ptr = pc[-2].info, ptr != (PageantClientInfo *)&pc[-2].info &&
         (pPVar1 = ptr[1].pc, pPVar1 != (PageantClient *)0x0))) {
    (**(code **)&(pc[-0x2aaf].info)->pc->suppress_logging)
              (pc[-0x2aaf].info,pPVar1->info,*(undefined8 *)&pPVar1->suppress_logging);
    pPVar1 = ptr->pc;
    pPVar1->info = (PageantClientInfo *)(ptr->head).prev;
    ((ptr->head).prev)->prev = (PageantClientRequestNode *)pPVar1;
    strbuf_free((strbuf *)ptr[1].pc);
    safefree(ptr);
  }
  return;
}

Assistant:

static void pageant_conn_got_response(
    PageantClient *pc, PageantClientRequestId *reqid, ptrlen response)
{
    struct pageant_conn_state *pcs =
        container_of(pc, struct pageant_conn_state, pc);
    struct pageant_conn_queued_response *qr =
        container_of(reqid, struct pageant_conn_queued_response, reqid);

    qr->sb = strbuf_new_nm();
    put_stringpl(qr->sb, response);

    while (pcs->response_queue.next != &pcs->response_queue &&
           pcs->response_queue.next->sb) {
        qr = pcs->response_queue.next;
        sk_write(pcs->connsock, qr->sb->u, qr->sb->len);
        qr->next->prev = qr->prev;
        qr->prev->next = qr->next;
        strbuf_free(qr->sb);
        sfree(qr);
    }
}